

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_islow(DCTELEM *data)

{
  short sVar1;
  short sVar2;
  int iVar3;
  DCTELEM *pDVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  pDVar4 = data;
  for (iVar3 = 7; -1 < iVar3; iVar3 = iVar3 + -1) {
    iVar12 = (int)pDVar4[7] + (int)*pDVar4;
    iVar5 = (int)*pDVar4 - (int)pDVar4[7];
    iVar11 = (int)pDVar4[6] + (int)pDVar4[1];
    iVar7 = (int)pDVar4[1] - (int)pDVar4[6];
    iVar6 = (int)pDVar4[5] + (int)pDVar4[2];
    iVar8 = (int)pDVar4[2] - (int)pDVar4[5];
    iVar13 = (int)pDVar4[4] + (int)pDVar4[3];
    iVar10 = (int)pDVar4[3] - (int)pDVar4[4];
    sVar1 = (short)iVar13 + (short)iVar12;
    iVar12 = iVar12 - iVar13;
    sVar2 = (short)iVar6 + (short)iVar11;
    iVar11 = iVar11 - iVar6;
    *pDVar4 = (sVar1 + sVar2) * 4;
    pDVar4[4] = (sVar1 - sVar2) * 4;
    iVar6 = (iVar12 + iVar11) * 0x1151;
    pDVar4[2] = (short)(iVar12 * 0x187e + iVar6 + 0x400U >> 0xb);
    pDVar4[6] = (short)(iVar11 * 0x7ffc4df + iVar6 + 0x400U >> 0xb);
    iVar12 = (iVar10 + iVar7 + iVar8 + iVar5) * 0x25a1;
    iVar11 = (iVar10 + iVar5) * -0x1ccd;
    iVar6 = (iVar8 + iVar7) * -0x5203;
    iVar13 = (iVar10 + iVar7) * -0x3ec5 + iVar12;
    iVar12 = (iVar8 + iVar5) * -0xc7c + iVar12;
    pDVar4[7] = (short)((uint)(iVar10 * 0x98e + iVar11 + 0x400 + iVar13) >> 0xb);
    pDVar4[5] = (short)((uint)(iVar6 + iVar8 * 0x41b3 + 0x400 + iVar12) >> 0xb);
    pDVar4[3] = (short)((uint)(iVar6 + iVar7 * 0x6254 + 0x400 + iVar13) >> 0xb);
    pDVar4[1] = (short)((uint)(iVar5 * 0x300b + iVar11 + 0x400 + iVar12) >> 0xb);
    pDVar4 = pDVar4 + 8;
  }
  for (iVar3 = 7; -1 < iVar3; iVar3 = iVar3 + -1) {
    iVar12 = (int)data[0x38] + (int)*data;
    iVar5 = (int)*data - (int)data[0x38];
    iVar11 = (int)data[0x30] + (int)data[8];
    iVar7 = (int)data[8] - (int)data[0x30];
    iVar6 = (int)data[0x28] + (int)data[0x10];
    iVar10 = (int)data[0x10] - (int)data[0x28];
    iVar13 = (int)data[0x20] + (int)data[0x18];
    iVar9 = (int)data[0x18] - (int)data[0x20];
    iVar8 = iVar13 + iVar12;
    iVar12 = iVar12 - iVar13;
    iVar13 = iVar6 + iVar11;
    iVar11 = iVar11 - iVar6;
    *data = (short)(iVar13 + iVar8 + 2U >> 2);
    data[0x20] = (short)((iVar8 - iVar13) + 2U >> 2);
    iVar6 = (iVar12 + iVar11) * 0x1151;
    data[0x10] = (short)(iVar12 * 0x187e + iVar6 + 0x4000U >> 0xf);
    data[0x30] = (short)(iVar11 * 0x7fffc4df + iVar6 + 0x4000U >> 0xf);
    iVar11 = (iVar9 + iVar7 + iVar10 + iVar5) * 0x25a1;
    iVar12 = (iVar9 + iVar5) * -0x1ccd;
    iVar6 = (iVar10 + iVar7) * -0x5203;
    iVar13 = (iVar9 + iVar7) * -0x3ec5 + iVar11;
    iVar11 = (iVar10 + iVar5) * -0xc7c + iVar11;
    data[0x38] = (short)((uint)(iVar9 * 0x98e + iVar12 + 0x4000 + iVar13) >> 0xf);
    data[0x28] = (short)((uint)(iVar6 + iVar10 * 0x41b3 + 0x4000 + iVar11) >> 0xf);
    data[0x18] = (short)((uint)(iVar6 + iVar7 * 0x6254 + 0x4000 + iVar13) >> 0xf);
    data[8] = (short)((uint)(iVar5 * 0x300b + iVar12 + 0x4000 + iVar11) >> 0xf);
    data = data + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_islow(DCTELEM *data)
{
  JLONG tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6, tmp7;
  JLONG tmp10, tmp11, tmp12, tmp13;
  JLONG z1, z2, z3, z4, z5;
  DCTELEM *dataptr;
  int ctr;
  SHIFT_TEMPS

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[0] + dataptr[7];
    tmp7 = dataptr[0] - dataptr[7];
    tmp1 = dataptr[1] + dataptr[6];
    tmp6 = dataptr[1] - dataptr[6];
    tmp2 = dataptr[2] + dataptr[5];
    tmp5 = dataptr[2] - dataptr[5];
    tmp3 = dataptr[3] + dataptr[4];
    tmp4 = dataptr[3] - dataptr[4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[0] = (DCTELEM)LEFT_SHIFT(tmp10 + tmp11, PASS1_BITS);
    dataptr[4] = (DCTELEM)LEFT_SHIFT(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[2] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                                  CONST_BITS - PASS1_BITS);
    dataptr[6] = (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                                  CONST_BITS - PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[7] = (DCTELEM)DESCALE(tmp4 + z1 + z3, CONST_BITS - PASS1_BITS);
    dataptr[5] = (DCTELEM)DESCALE(tmp5 + z2 + z4, CONST_BITS - PASS1_BITS);
    dataptr[3] = (DCTELEM)DESCALE(tmp6 + z2 + z3, CONST_BITS - PASS1_BITS);
    dataptr[1] = (DCTELEM)DESCALE(tmp7 + z1 + z4, CONST_BITS - PASS1_BITS);

    dataptr += DCTSIZE;         /* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   */

  dataptr = data;
  for (ctr = DCTSIZE - 1; ctr >= 0; ctr--) {
    tmp0 = dataptr[DCTSIZE * 0] + dataptr[DCTSIZE * 7];
    tmp7 = dataptr[DCTSIZE * 0] - dataptr[DCTSIZE * 7];
    tmp1 = dataptr[DCTSIZE * 1] + dataptr[DCTSIZE * 6];
    tmp6 = dataptr[DCTSIZE * 1] - dataptr[DCTSIZE * 6];
    tmp2 = dataptr[DCTSIZE * 2] + dataptr[DCTSIZE * 5];
    tmp5 = dataptr[DCTSIZE * 2] - dataptr[DCTSIZE * 5];
    tmp3 = dataptr[DCTSIZE * 3] + dataptr[DCTSIZE * 4];
    tmp4 = dataptr[DCTSIZE * 3] - dataptr[DCTSIZE * 4];

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp10 = tmp0 + tmp3;
    tmp13 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp1 - tmp2;

    dataptr[DCTSIZE * 0] = (DCTELEM)DESCALE(tmp10 + tmp11, PASS1_BITS);
    dataptr[DCTSIZE * 4] = (DCTELEM)DESCALE(tmp10 - tmp11, PASS1_BITS);

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    dataptr[DCTSIZE * 2] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp13, FIX_0_765366865),
                       CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 6] =
      (DCTELEM)DESCALE(z1 + MULTIPLY(tmp12, -FIX_1_847759065),
                       CONST_BITS + PASS1_BITS);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * cK represents cos(K*pi/16).
     * i0..i3 in the paper are tmp4..tmp7 here.
     */

    z1 = tmp4 + tmp7;
    z2 = tmp5 + tmp6;
    z3 = tmp4 + tmp6;
    z4 = tmp5 + tmp7;
    z5 = MULTIPLY(z3 + z4, FIX_1_175875602); /* sqrt(2) * c3 */

    tmp4 = MULTIPLY(tmp4, FIX_0_298631336); /* sqrt(2) * (-c1+c3+c5-c7) */
    tmp5 = MULTIPLY(tmp5, FIX_2_053119869); /* sqrt(2) * ( c1+c3-c5+c7) */
    tmp6 = MULTIPLY(tmp6, FIX_3_072711026); /* sqrt(2) * ( c1+c3+c5-c7) */
    tmp7 = MULTIPLY(tmp7, FIX_1_501321110); /* sqrt(2) * ( c1+c3-c5-c7) */
    z1 = MULTIPLY(z1, -FIX_0_899976223); /* sqrt(2) * ( c7-c3) */
    z2 = MULTIPLY(z2, -FIX_2_562915447); /* sqrt(2) * (-c1-c3) */
    z3 = MULTIPLY(z3, -FIX_1_961570560); /* sqrt(2) * (-c3-c5) */
    z4 = MULTIPLY(z4, -FIX_0_390180644); /* sqrt(2) * ( c5-c3) */

    z3 += z5;
    z4 += z5;

    dataptr[DCTSIZE * 7] = (DCTELEM)DESCALE(tmp4 + z1 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 5] = (DCTELEM)DESCALE(tmp5 + z2 + z4,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 3] = (DCTELEM)DESCALE(tmp6 + z2 + z3,
                                            CONST_BITS + PASS1_BITS);
    dataptr[DCTSIZE * 1] = (DCTELEM)DESCALE(tmp7 + z1 + z4,
                                            CONST_BITS + PASS1_BITS);

    dataptr++;                  /* advance pointer to next column */
  }
}